

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timTime.c
# Opt level: O3

void Tim_ManSetCoArrival(Tim_Man_t *p,int iCo,float Delay)

{
  Tim_Obj_t *pTVar1;
  int iVar2;
  
  if (p->nCos <= iCo) {
    __assert_fail("iCo < p->nCos",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/tim/timTime.c"
                  ,0x76,"void Tim_ManSetCoArrival(Tim_Man_t *, int, float)");
  }
  pTVar1 = p->pCos;
  if (p->fUseTravId == 0) {
    iVar2 = p->nTravIds;
  }
  else {
    iVar2 = p->nTravIds;
    if (pTVar1[iCo].TravId == iVar2) {
      __assert_fail("!p->fUseTravId || p->pCos[iCo].TravId != p->nTravIds",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/tim/timTime.c"
                    ,0x77,"void Tim_ManSetCoArrival(Tim_Man_t *, int, float)");
    }
  }
  pTVar1[iCo].timeArr = Delay;
  pTVar1[iCo].TravId = iVar2;
  return;
}

Assistant:

void Tim_ManSetCoArrival( Tim_Man_t * p, int iCo, float Delay )
{
    assert( iCo < p->nCos );
    assert( !p->fUseTravId || p->pCos[iCo].TravId != p->nTravIds );
    p->pCos[iCo].timeArr = Delay;
    p->pCos[iCo].TravId = p->nTravIds;
}